

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderArrow(ImVec2 p_min,ImGuiDir dir,float scale)

{
  uint in_EDI;
  float in_XMM1_Da;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 center;
  float r;
  float h;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffed8;
  ImU32 col;
  ImDrawList *c_00;
  ImVec2 *in_stack_fffffffffffffef0;
  ImVec2 *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  float local_20;
  float local_1c;
  ImGuiContext *local_18;
  uint local_c;
  
  local_18 = GImGui;
  local_1c = GImGui->FontSize;
  local_20 = local_1c * 0.4 * in_XMM1_Da;
  local_c = in_EDI;
  ImVec2::ImVec2(&local_30,local_1c * 0.5,local_1c * 0.5 * in_XMM1_Da);
  local_28 = operator+(in_stack_fffffffffffffed8,(ImVec2 *)0x135e2c);
  ImVec2::ImVec2(&local_38);
  ImVec2::ImVec2(&local_40);
  ImVec2::ImVec2(&local_48);
  if (local_c != 0xffffffff) {
    if (local_c < 2) {
      if (local_c == 0) {
        local_20 = -local_20;
      }
      in_stack_fffffffffffffef0 = &local_88;
      ImVec2::ImVec2(in_stack_fffffffffffffef0,0.75,0.0);
      local_80 = operator*(in_stack_fffffffffffffed8,0.0);
      in_stack_fffffffffffffef8 = &local_98;
      in_stack_ffffffffffffff04 = -0.75;
      local_38 = local_80;
      ImVec2::ImVec2(in_stack_fffffffffffffef8,-0.75,0.866);
      local_90 = operator*(in_stack_fffffffffffffed8,0.0);
      local_40 = local_90;
      ImVec2::ImVec2(&local_a8,in_stack_ffffffffffffff04,-0.866);
      local_a0 = operator*(in_stack_fffffffffffffed8,0.0);
      local_48 = local_a0;
    }
    else if (local_c - 2 < 2) {
      if (local_c == 2) {
        local_20 = -local_20;
      }
      ImVec2::ImVec2(&local_58,0.0,0.75);
      local_50 = operator*(in_stack_fffffffffffffed8,0.0);
      local_38 = local_50;
      ImVec2::ImVec2(&local_68,-0.866,-0.75);
      local_60 = operator*(in_stack_fffffffffffffed8,0.0);
      local_40 = local_60;
      ImVec2::ImVec2(&local_78,0.866,-0.75);
      local_70 = operator*(in_stack_fffffffffffffed8,0.0);
      local_48 = local_70;
    }
  }
  c_00 = local_18->CurrentWindow->DrawList;
  col = (ImU32)((ulong)&local_28 >> 0x20);
  operator+(in_stack_fffffffffffffed8,(ImVec2 *)0x136106);
  operator+(in_stack_fffffffffffffed8,(ImVec2 *)0x13611e);
  operator+(in_stack_fffffffffffffed8,(ImVec2 *)0x136136);
  GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffef0 >> 0x20),
              SUB84(in_stack_fffffffffffffef0,0));
  ImDrawList::AddTriangleFilled
            ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,(ImVec2 *)c_00,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImVec2 p_min, ImGuiDir dir, float scale)
{
    ImGuiContext& g = *GImGui;

    const float h = g.FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        a = ImVec2(+0.000f,+0.750f) * r;
        b = ImVec2(-0.866f,-0.750f) * r;
        c = ImVec2(+0.866f,-0.750f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        a = ImVec2(+0.750f,+0.000f) * r;
        b = ImVec2(-0.750f,+0.866f) * r;
        c = ImVec2(-0.750f,-0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }

    g.CurrentWindow->DrawList->AddTriangleFilled(center + a, center + b, center + c, GetColorU32(ImGuiCol_Text));
}